

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

iterator __thiscall
QVLABase<QDialogButtonBox::StandardButton>::emplace_impl<QDialogButtonBox::StandardButton_const&>
          (QVLABase<QDialogButtonBox::StandardButton> *this,qsizetype prealloc,void *array,
          const_iterator before,StandardButton *args)

{
  const_iterator pSVar1;
  QVLABase<QDialogButtonBox::StandardButton> *this_00;
  iterator pSVar2;
  iterator last;
  QVLABase<QDialogButtonBox::StandardButton> *in_RCX;
  StandardButton *in_RDI;
  iterator e;
  iterator b;
  qsizetype offset;
  void *in_stack_ffffffffffffffc0;
  qsizetype in_stack_ffffffffffffffc8;
  
  pSVar1 = cbegin((QVLABase<QDialogButtonBox::StandardButton> *)0x672aaa);
  this_00 = (QVLABase<QDialogButtonBox::StandardButton> *)((long)in_RCX - (long)pSVar1 >> 2);
  emplace_back_impl<QDialogButtonBox::StandardButton_const&>
            (this_00,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_RDI);
  pSVar2 = begin((QVLABase<QDialogButtonBox::StandardButton> *)0x672ae1);
  pSVar2 = pSVar2 + (long)this_00;
  last = end(in_RCX);
  QtPrivate::q_rotate<QDialogButtonBox::StandardButton>((StandardButton *)this_00,pSVar2,last);
  return pSVar2;
}

Assistant:

Q_OUTOFLINE_TEMPLATE auto QVLABase<T>::emplace_impl(qsizetype prealloc, void *array, const_iterator before, Args &&...args) -> iterator
{
    Q_ASSERT_X(isValidIterator(before), "QVarLengthArray::insert", "The specified const_iterator argument 'before' is invalid");
    Q_ASSERT(size() <= capacity());
    Q_ASSERT(capacity() > 0);

    const qsizetype offset = qsizetype(before - cbegin());
    emplace_back_impl(prealloc, array, std::forward<Args>(args)...);
    const auto b = begin() + offset;
    const auto e = end();
    QtPrivate::q_rotate(b, e - 1, e);
    return b;
}